

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::Promise<void>::eagerlyEvaluate<kj::(anonymous_namespace)::TestCase2681::run()::__4>
          (Promise<void> *this,Type *errorHandler)

{
  NoInfer<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2693:24)>
  *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Type local_41;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  Type *errorHandler_local;
  Promise<void> *this_local;
  
  errorHandler_local = errorHandler;
  this_local = this;
  fwd<kj::(anonymous_namespace)::TestCase2681::run()::__4>(in_RDX);
  then<kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::TestCase2681::run()::__4>
            ((Promise<void> *)&local_40,(IdentityFunc<void> *)errorHandler,&local_41);
  _::spark<kj::_::Void>((_ *)&local_30,&local_40);
  Promise(this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  ~Promise((Promise<void> *)&local_40);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::eagerlyEvaluate(ErrorFunc&& errorHandler) {
  // See catch_() for commentary.
  return Promise(false, _::spark<_::FixVoid<T>>(then(
      _::IdentityFunc<decltype(errorHandler(instance<Exception&&>()))>(),
      kj::fwd<ErrorFunc>(errorHandler)).node));
}